

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1532.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long in_RAX;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uStack_30;
  long httpcode;
  
  httpcode = in_RAX;
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                  ,0x22,iVar1,uVar3);
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                  ,0x24);
    iVar1 = 0x7c;
    goto LAB_00102368;
  }
  iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
  uVar6 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_perform(lVar4);
    uVar6 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_getinfo(lVar4,0x200002,&httpcode);
      uVar6 = _stderr;
      if (iVar1 == 0) {
        if (httpcode == 200) {
          curl_easy_reset(lVar4);
          iVar1 = 0;
          iVar2 = curl_easy_getinfo(lVar4,0x200002,&httpcode);
          uVar6 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar6,"%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                          ,0x42,iVar2,uVar3);
            iVar1 = iVar2;
            goto LAB_00102368;
          }
          if (httpcode == 0) goto LAB_00102368;
          curl_mfprintf(_stderr,
                        "%s:%d curl_easy_reset failed to zero the response code\npossible regression of github bug 1017\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                        ,0x47);
        }
        else {
          curl_mfprintf(_stderr,"%s:%d unexpected response code %ld\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                        ,0x37);
        }
        iVar1 = 0x16;
        goto LAB_00102368;
      }
      uVar3 = curl_easy_strerror(iVar1);
      pcVar5 = "%s:%d curl_easy_getinfo() failed with code %d (%s)\n";
      uStack_30 = 0x32;
    }
    else {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar5 = "%s:%d curl_easy_perform() failed with code %d (%s)\n";
      uStack_30 = 0x2b;
    }
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    uStack_30 = 0x26;
  }
  curl_mfprintf(uVar6,pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1532.c"
                ,uStack_30,iVar1,uVar3);
LAB_00102368:
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  long httpcode;
  int res = CURLE_OK;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);

  res = curl_easy_perform(curl);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }

  res = curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpcode);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(httpcode != 200) {
    fprintf(stderr, "%s:%d unexpected response code %ld\n",
            __FILE__, __LINE__, httpcode);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

  /* Test for a regression of github bug 1017 (response code does not reset) */
  curl_easy_reset(curl);

  res = curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpcode);
  if(res) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed with code %d (%s)\n",
            __FILE__, __LINE__, res, curl_easy_strerror(res));
    goto test_cleanup;
  }
  if(httpcode != 0) {
    fprintf(stderr, "%s:%d curl_easy_reset failed to zero the response code\n"
            "possible regression of github bug 1017\n", __FILE__, __LINE__);
    res = CURLE_HTTP_RETURNED_ERROR;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return res;
}